

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

vmd_bst_node_t * vmd_bst_node_adj(vmd_bst_node_t *node,int dir)

{
  undefined1 *puVar1;
  vmd_bst_node_t *pvVar2;
  
  if (node->child[dir] != (vmd_bst_node_t *)0x0) {
    pvVar2 = vmd_bst_node_child_most(node->child[dir],(uint)(dir == 0));
    return pvVar2;
  }
  do {
    pvVar2 = node->parent;
    if (node == pvVar2) {
      return node;
    }
    puVar1 = &node->field_0x20;
    node = pvVar2;
  } while ((*(uint *)puVar1 >> 3 & 1) == dir);
  return pvVar2;
}

Assistant:

bst_node_t *
bst_node_adj(bst_node_t *node, int dir)
{
	if (node->child[dir] != NULL)
		return bst_node_child_most(node->child[dir], !dir);

	for (; !bst_node_is_end(node); node = node->parent) {
		if (node->idx != dir)
			return node->parent;
	}

	return node;
}